

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

int google::protobuf::Base64EscapeInternal
              (uchar *src,int szsrc,char *dest,int szdest,char *base64,bool do_padding)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  uint16 uVar4;
  int iVar5;
  uint32 uVar6;
  uint uVar7;
  LogMessage *other;
  int in_ECX;
  LogMessage *in_RDX;
  int in_ESI;
  byte *in_RDI;
  long in_R8;
  byte in_R9B;
  uint32 in_3;
  uint32 in_2;
  uint32 in_1;
  uint32 in;
  uchar *limit_src;
  char *limit_dest;
  uchar *cur_src;
  char *cur_dest;
  char *in_stack_ffffffffffffff28;
  LogMessage *pLVar8;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  LogMessage local_a0;
  uint local_5c;
  byte *local_58;
  long local_50;
  int local_48;
  LogMessage *this;
  int local_4;
  
  if (in_ESI < 1) {
    local_4 = 0;
  }
  else {
    iVar5 = in_ESI * 4;
    if (iVar5 == in_ECX * 3 || SBORROW4(iVar5,in_ECX * 3) != iVar5 + in_ECX * -3 < 0) {
      local_50 = (long)&in_RDX->level_ + (long)in_ECX;
      local_58 = in_RDI + in_ESI;
      this = in_RDX;
      for (_local_48 = in_RDI; _local_48 < local_58 + -3; _local_48 = _local_48 + 3) {
        uVar6 = BigEndian::Load32((void *)0x4440a9);
        local_5c = uVar6 >> 8;
        *(undefined1 *)&this->level_ = *(undefined1 *)(in_R8 + (ulong)(uVar6 >> 0x1a));
        *(byte *)((long)&this->level_ + 1) = *(byte *)(in_R8 + (ulong)((local_5c & 0x3ffff) >> 0xc))
        ;
        *(byte *)((long)&this->level_ + 2) = *(byte *)(in_R8 + (ulong)((local_5c & 0xfff) >> 6));
        local_5c = local_5c & 0x3f;
        *(byte *)((long)&this->level_ + 3) = *(byte *)(in_R8 + (ulong)local_5c);
        this = (LogMessage *)&this->field_0x4;
      }
      iVar5 = (int)local_50 - (int)this;
      switch((int)local_58 - local_48) {
      case 0:
        pLVar8 = this;
        break;
      case 1:
        if (iVar5 + -2 < 0) {
          return 0;
        }
        bVar1 = *_local_48;
        *(undefined1 *)&this->level_ = *(undefined1 *)(in_R8 + (ulong)(bVar1 >> 2));
        *(byte *)((long)&this->level_ + 1) = *(byte *)(in_R8 + (ulong)((bVar1 & 3) << 4));
        pLVar8 = (LogMessage *)((long)&this->level_ + 2);
        if ((in_R9B & 1) != 0) {
          if (iVar5 + -4 < 0) {
            return 0;
          }
          *(undefined1 *)&pLVar8->level_ = 0x3d;
          *(byte *)((long)&this->level_ + 3) = 0x3d;
          pLVar8 = (LogMessage *)&this->field_0x4;
        }
        break;
      case 2:
        if (iVar5 + -3 < 0) {
          return 0;
        }
        uVar4 = BigEndian::Load16((void *)0x4442fa);
        *(undefined1 *)&this->level_ = *(undefined1 *)(in_R8 + (ulong)(uVar4 >> 10));
        *(byte *)((long)&this->level_ + 1) = *(byte *)(in_R8 + (ulong)((uVar4 & 0x3ff) >> 4));
        *(byte *)((long)&this->level_ + 2) = *(byte *)(in_R8 + (ulong)((uVar4 & 0xf) << 2));
        pLVar8 = (LogMessage *)((long)&this->level_ + 3);
        if ((in_R9B & 1) != 0) {
          if (iVar5 + -4 < 0) {
            return 0;
          }
          *(undefined1 *)&pLVar8->level_ = 0x3d;
          pLVar8 = (LogMessage *)&this->field_0x4;
        }
        break;
      case 3:
        if (iVar5 + -4 < 0) {
          return 0;
        }
        iVar5 = (uint)*_local_48 << 0x10;
        uVar4 = BigEndian::Load16((void *)0x444426);
        uVar7 = iVar5 + (uint)uVar4;
        *(undefined1 *)&this->level_ = *(undefined1 *)(in_R8 + (ulong)(uVar7 >> 0x12));
        *(byte *)((long)&this->level_ + 1) = *(byte *)(in_R8 + (ulong)((uVar7 & 0x3ffff) >> 0xc));
        *(byte *)((long)&this->level_ + 2) = *(byte *)(in_R8 + (ulong)((uVar7 & 0xfff) >> 6));
        *(byte *)((long)&this->level_ + 3) = *(byte *)(in_R8 + (ulong)(uVar7 & 0x3f));
        pLVar8 = (LogMessage *)&this->field_0x4;
        break;
      default:
        pLVar8 = &local_a0;
        internal::LogMessage::LogMessage
                  ((LogMessage *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (LogLevel)((ulong)in_stack_ffffffffffffff38 >> 0x20),(char *)pLVar8,
                   (int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
        internal::LogMessage::operator<<(pLVar8,in_stack_ffffffffffffff28);
        pbVar3 = _local_48;
        uVar2 = (ulong)_local_48 >> 0x20;
        iVar5 = (int)uVar2;
        _local_48 = pbVar3;
        other = internal::LogMessage::operator<<(this,iVar5);
        internal::LogFinisher::operator=((LogFinisher *)pLVar8,other);
        internal::LogMessage::~LogMessage((LogMessage *)0x444553);
        pLVar8 = this;
      }
      local_4 = (int)pLVar8 - (int)in_RDX;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Base64EscapeInternal(const unsigned char *src, int szsrc,
                         char *dest, int szdest, const char *base64,
                         bool do_padding) {
  static const char kPad64 = '=';

  if (szsrc <= 0) return 0;

  if (szsrc * 4 > szdest * 3) return 0;

  char *cur_dest = dest;
  const unsigned char *cur_src = src;

  char *limit_dest = dest + szdest;
  const unsigned char *limit_src = src + szsrc;

  // Three bytes of data encodes to four characters of cyphertext.
  // So we can pump through three-byte chunks atomically.
  while (cur_src < limit_src - 3) {  // keep going as long as we have >= 32 bits
    uint32 in = BigEndian::Load32(cur_src) >> 8;

    cur_dest[0] = base64[in >> 18];
    in &= 0x3FFFF;
    cur_dest[1] = base64[in >> 12];
    in &= 0xFFF;
    cur_dest[2] = base64[in >> 6];
    in &= 0x3F;
    cur_dest[3] = base64[in];

    cur_dest += 4;
    cur_src += 3;
  }
  // To save time, we didn't update szdest or szsrc in the loop.  So do it now.
  szdest = limit_dest - cur_dest;
  szsrc = limit_src - cur_src;

  /* now deal with the tail (<=3 bytes) */
  switch (szsrc) {
    case 0:
      // Nothing left; nothing more to do.
      break;
    case 1: {
      // One byte left: this encodes to two characters, and (optionally)
      // two pad characters to round out the four-character cypherblock.
      if ((szdest -= 2) < 0) return 0;
      uint32 in = cur_src[0];
      cur_dest[0] = base64[in >> 2];
      in &= 0x3;
      cur_dest[1] = base64[in << 4];
      cur_dest += 2;
      if (do_padding) {
        if ((szdest -= 2) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest[1] = kPad64;
        cur_dest += 2;
      }
      break;
    }
    case 2: {
      // Two bytes left: this encodes to three characters, and (optionally)
      // one pad character to round out the four-character cypherblock.
      if ((szdest -= 3) < 0) return 0;
      uint32 in = BigEndian::Load16(cur_src);
      cur_dest[0] = base64[in >> 10];
      in &= 0x3FF;
      cur_dest[1] = base64[in >> 4];
      in &= 0x00F;
      cur_dest[2] = base64[in << 2];
      cur_dest += 3;
      if (do_padding) {
        if ((szdest -= 1) < 0) return 0;
        cur_dest[0] = kPad64;
        cur_dest += 1;
      }
      break;
    }
    case 3: {
      // Three bytes left: same as in the big loop above.  We can't do this in
      // the loop because the loop above always reads 4 bytes, and the fourth
      // byte is past the end of the input.
      if ((szdest -= 4) < 0) return 0;
      uint32 in = (cur_src[0] << 16) + BigEndian::Load16(cur_src + 1);
      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];
      cur_dest += 4;
      break;
    }
    default:
      // Should not be reached: blocks of 4 bytes are handled
      // in the while loop before this switch statement.
      GOOGLE_LOG(FATAL) << "Logic problem? szsrc = " << szsrc;
      break;
  }
  return (cur_dest - dest);
}